

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O2

long coda_c_index_to_fortran_index(int num_dims,long *dim,long index)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long d [8];
  
  if (num_dims < 9) {
    for (lVar1 = (long)(num_dims + -1); -1 < lVar1; lVar1 = lVar1 + -1) {
      lVar3 = dim[lVar1];
      d[lVar1] = index % lVar3;
      index = index / lVar3;
    }
    uVar2 = 0;
    uVar4 = (ulong)(uint)num_dims;
    if (num_dims < 1) {
      uVar4 = uVar2;
    }
    lVar3 = 1;
    lVar1 = 0;
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      lVar1 = lVar1 + d[uVar2] * lVar3;
      lVar3 = lVar3 * dim[uVar2];
    }
  }
  else {
    coda_set_error(-100,"num_dims argument (%d) exceeds limit (%d)",(ulong)(uint)num_dims,8);
    lVar1 = -1;
  }
  return lVar1;
}

Assistant:

LIBCODA_API long coda_c_index_to_fortran_index(int num_dims, const long dim[], long index)
{
    long i, indexf, multiplier, d[CODA_MAX_NUM_DIMS];

    if (num_dims > CODA_MAX_NUM_DIMS)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "num_dims argument (%d) exceeds limit (%d)", num_dims,
                       CODA_MAX_NUM_DIMS);
        return -1;
    }

    for (i = num_dims - 1; i >= 0; i--)
    {
        d[i] = index % dim[i];
        index /= dim[i];
    }

    indexf = 0;
    multiplier = 1;

    for (i = 0; i < num_dims; i++)
    {
        indexf += multiplier * d[i];
        multiplier *= dim[i];
    }

    return indexf;
}